

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polygon.cpp
# Opt level: O1

void polygon_web_validate(Am_Web_Events *events)

{
  bool bVar1;
  bool bVar2;
  Am_Slot_Key AVar3;
  Am_Drawonable *pAVar4;
  Am_Value *pAVar5;
  undefined8 extraout_RAX;
  undefined8 extraout_RAX_00;
  undefined8 uVar6;
  Am_Wrapper *value;
  char *pcVar7;
  ostream *poVar8;
  ulong uVar9;
  undefined7 uVar10;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  int iVar11;
  float fVar12;
  float fVar13;
  float fVar14;
  int height;
  int top;
  int left;
  Am_Object self;
  int width;
  int pl_top;
  int pl_left;
  Am_Style ls;
  Am_Point_List pl;
  int curr_width;
  int curr_top;
  int curr_left;
  int pl_height;
  int pl_width;
  Am_Point_List new_pl;
  Am_Slot slot;
  int local_d4;
  int local_d0;
  int local_cc;
  Am_Object local_c8;
  float local_bc;
  int local_b8;
  float local_b4;
  float local_b0;
  uint local_ac;
  float local_a8;
  float local_a4;
  float local_a0;
  float local_9c;
  float local_98;
  int local_94;
  int local_90;
  int local_8c;
  Am_Style local_88;
  Am_Style local_80;
  Am_Point_List local_78;
  int local_64;
  int local_60;
  int local_5c;
  int local_58;
  int local_54;
  Am_Point_List local_50;
  Am_Slot local_40;
  Am_Object local_38;
  
  Am_Web_Events::End(events);
  local_40 = Am_Web_Events::Get(events);
  Am_Slot::Get_Owner((Am_Slot *)&local_50);
  Am_Object::Am_Object(&local_c8,(Am_Object *)&local_50);
  Am_Object::~Am_Object((Am_Object *)&local_50);
  Am_Object::Am_Object(&local_38,&local_c8);
  pAVar4 = Get_a_drawonable(&local_38);
  Am_Object::~Am_Object(&local_38);
  pAVar5 = Am_Object::Get(&local_c8,0xb2,0);
  Am_Point_List::Am_Point_List(&local_78,pAVar5);
  pAVar5 = Am_Object::Get(&local_c8,0x6b,0);
  Am_Style::Am_Style(&local_88,pAVar5);
  pAVar5 = Am_Object::Get(&local_c8,100,0);
  local_cc = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(&local_c8,0x65,0);
  local_d0 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(&local_c8,0x66,0);
  local_b8 = Am_Value::operator_cast_to_int(pAVar5);
  pAVar5 = Am_Object::Get(&local_c8,0x67,0);
  local_d4 = Am_Value::operator_cast_to_int(pAVar5);
  Am_Web_Events::End(events);
  local_ac = 0;
  do {
    bVar1 = Am_Web_Events::First(events);
    if (bVar1) break;
    local_40 = Am_Web_Events::Get(events);
    AVar3 = Am_Slot::Get_Key(&local_40);
    switch(AVar3) {
    case 100:
      pAVar5 = Am_Web_Events::Get_Prev_Value(events);
      local_cc = Am_Value::operator_cast_to_int(pAVar5);
      break;
    case 0x65:
      pAVar5 = Am_Web_Events::Get_Prev_Value(events);
      local_d0 = Am_Value::operator_cast_to_int(pAVar5);
      break;
    case 0x66:
      pAVar5 = Am_Web_Events::Get_Prev_Value(events);
      local_b8 = Am_Value::operator_cast_to_int(pAVar5);
      break;
    case 0x67:
      pAVar5 = Am_Web_Events::Get_Prev_Value(events);
      local_d4 = Am_Value::operator_cast_to_int(pAVar5);
      break;
    case 0x68:
      break;
    case 0x69:
    case 0x6a:
switchD_001e7c9c_caseD_69:
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"** Amulet_Error: ",0x11);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"** Bug: unexpected slot in polygon_web_validate: ",0x31);
      pcVar7 = Am_Get_Slot_Name(AVar3);
      poVar8 = std::operator<<((ostream *)&std::cerr,pcVar7);
      std::endl<char,std::char_traits<char>>(poVar8);
      Am_Error();
    case 0x6b:
      pAVar5 = Am_Web_Events::Get_Prev_Value(events);
      Am_Style::operator=(&local_88,pAVar5);
      break;
    default:
      if (AVar3 == 0x7d2) break;
      if (AVar3 != 0xb2) goto switchD_001e7c9c_caseD_69;
      bVar1 = Am_Point_List::Valid(&local_78);
      local_ac = (uint)CONCAT71((int7)((ulong)extraout_RDX >> 8),1);
      if (bVar1 && pAVar4 != (Am_Drawonable *)0x0) {
        (*pAVar4->_vptr_Am_Drawonable[0x1c])
                  (pAVar4,&local_78,&local_88,&local_cc,&local_d0,&local_b8,&local_d4);
      }
      bVar1 = false;
      goto LAB_001e7d7e;
    }
    bVar1 = true;
    Am_Web_Events::Prev(events);
LAB_001e7d7e:
  } while (bVar1);
  Am_Web_Events::Next(events);
  bVar1 = false;
  local_bc = 0.0;
  do {
    bVar2 = Am_Web_Events::Last(events);
    if (bVar2) {
      if ((((uint)local_bc & 1) != 0) &&
         (bVar2 = Am_Point_List::Valid(&local_78), bVar2 && pAVar4 != (Am_Drawonable *)0x0)) {
        Am_Style::Am_Style(&local_80,&local_88);
        (*pAVar4->_vptr_Am_Drawonable[0x1c])
                  (pAVar4,&local_78,&local_80,&local_8c,&local_90,&local_54,&local_58);
        if ((local_cc != local_8c) ||
           (((local_d0 != local_90 || (local_b8 != local_54)) || (local_d4 != local_58)))) {
          local_b0 = 0.25;
          local_bc = 0.25;
          if (1 < local_b8) {
            local_b0 = (float)(local_b8 + -1);
          }
          if (local_54 < 2) {
            local_a8 = 0.25;
          }
          else {
            local_a8 = (float)(local_54 + -1);
          }
          if (local_d4 < 2) {
            local_b4 = 0.25;
          }
          else {
            local_b4 = (float)(local_d4 + -1);
          }
          if (1 < local_58) {
            local_bc = (float)(local_58 + -1);
          }
          Am_Point_List::Am_Point_List(&local_50,&local_78);
          local_b0 = local_b0 / local_a8;
          local_98 = local_b0 * 0.5;
          local_b0 = local_b0 + local_b0;
          local_9c = (local_98 + local_b0) * 0.5;
          local_b4 = local_b4 / local_bc;
          local_a4 = local_b4 * 0.5;
          local_b4 = local_b4 + local_b4;
          local_a0 = (local_a4 + local_b4) * 0.5;
          Am_Point_List::Scale(&local_50,local_9c,local_a0,local_8c,local_90,true);
          (*pAVar4->_vptr_Am_Drawonable[0x1c])
                    (pAVar4,&local_50,&local_80,&local_5c,&local_60,&local_64,&local_94);
          fVar14 = local_9c;
          fVar12 = local_a0;
          for (iVar11 = 0x10; ((local_64 != local_b8 || (local_94 != local_d4)) && (0 < iVar11));
              iVar11 = iVar11 + -1) {
            fVar13 = fVar14;
            if ((local_64 < local_b8) || (fVar13 = local_98, local_64 <= local_b8)) {
              local_98 = fVar13;
              fVar14 = local_b0;
            }
            local_bc = (local_98 + fVar14) * 0.5;
            fVar13 = fVar12;
            local_a0 = local_b4;
            if ((local_d4 <= local_94) &&
               (fVar13 = local_a4, local_a0 = fVar12, local_94 <= local_d4)) {
              local_a0 = local_b4;
            }
            local_a8 = (fVar13 + local_a0) * 0.5;
            local_a4 = fVar13;
            local_9c = fVar14;
            Am_Point_List::operator=(&local_50,&local_78);
            Am_Point_List::Scale(&local_50,local_bc,local_a8,local_8c,local_90,true);
            (*pAVar4->_vptr_Am_Drawonable[0x1c])
                      (pAVar4,&local_50,&local_80,&local_5c,&local_60,&local_64,&local_94);
            local_b0 = local_9c;
            local_b4 = local_a0;
            fVar14 = local_bc;
            fVar12 = local_a8;
          }
          Am_Point_List::Translate(&local_50,local_cc - local_5c,local_d0 - local_60,true);
          Am_Point_List::operator=(&local_78,&local_50);
          Am_Point_List::~Am_Point_List(&local_50);
        }
        Am_Style::~Am_Style(&local_80);
      }
      if (bVar1) {
        value = Am_Point_List::operator_cast_to_Am_Wrapper_(&local_78);
        Am_Object::Set(&local_c8,0xb2,value,0);
      }
      if ((local_ac & 1) != 0) {
        Am_Object::Set(&local_c8,100,local_cc,0);
        Am_Object::Set(&local_c8,0x65,local_d0,0);
        Am_Object::Set(&local_c8,0x66,local_b8,0);
        Am_Object::Set(&local_c8,0x67,local_d4,0);
      }
      Am_Style::~Am_Style(&local_88);
      Am_Point_List::~Am_Point_List(&local_78);
      Am_Object::~Am_Object(&local_c8);
      return;
    }
    local_40 = Am_Web_Events::Get(events);
    AVar3 = Am_Slot::Get_Key(&local_40);
    uVar9 = (ulong)(AVar3 - 100);
    switch(uVar9) {
    case 0:
      pAVar5 = Am_Object::Get(&local_c8,100,4);
      iVar11 = Am_Value::operator_cast_to_int(pAVar5);
      Am_Point_List::Translate(&local_78,iVar11 - local_cc,0,true);
      local_cc = iVar11;
      goto LAB_001e7e8d;
    case 1:
      pAVar5 = Am_Object::Get(&local_c8,0x65,4);
      iVar11 = Am_Value::operator_cast_to_int(pAVar5);
      Am_Point_List::Translate(&local_78,0,iVar11 - local_d0,true);
      local_d0 = iVar11;
LAB_001e7e8d:
      bVar1 = true;
      break;
    case 2:
      pAVar5 = Am_Object::Get(&local_c8,0x66,4);
      iVar11 = Am_Value::operator_cast_to_int(pAVar5);
      if (iVar11 < 2) {
        fVar14 = 0.25;
      }
      else {
        fVar14 = (float)(iVar11 + -1);
      }
      if (local_b8 < 2) {
        fVar12 = 0.25;
      }
      else {
        fVar12 = (float)(local_b8 + -1);
      }
      Am_Point_List::Scale(&local_78,fVar14 / fVar12,1.0,local_cc,local_d0,true);
      uVar6 = extraout_RAX;
      local_b8 = iVar11;
      goto LAB_001e8004;
    case 3:
      pAVar5 = Am_Object::Get(&local_c8,0x67,4);
      iVar11 = Am_Value::operator_cast_to_int(pAVar5);
      if (iVar11 < 2) {
        fVar14 = 0.25;
      }
      else {
        fVar14 = (float)(iVar11 + -1);
      }
      if (local_d4 < 2) {
        fVar12 = 0.25;
      }
      else {
        fVar12 = (float)(local_d4 + -1);
      }
      Am_Point_List::Scale(&local_78,1.0,fVar14 / fVar12,local_cc,local_d0,true);
      uVar6 = extraout_RAX_00;
      local_d4 = iVar11;
LAB_001e8004:
      bVar1 = true;
      local_bc = (float)CONCAT71((int7)((ulong)uVar6 >> 8),1);
      break;
    case 4:
switchD_001e7de9_caseD_4:
      bVar2 = Am_Point_List::Valid(&local_78);
      uVar10 = (undefined7)(uVar9 >> 8);
      local_ac = (uint)CONCAT71((int7)((ulong)extraout_RDX_00 >> 8),1);
      if (bVar2 && pAVar4 != (Am_Drawonable *)0x0) {
LAB_001e7ed2:
        local_ac = (uint)CONCAT71(uVar10,1);
        (*pAVar4->_vptr_Am_Drawonable[0x1c])
                  (pAVar4,&local_78,&local_88,&local_cc,&local_d0,&local_b8,&local_d4);
      }
      break;
    case 5:
    case 6:
      break;
    case 7:
      pAVar5 = Am_Object::Get(&local_c8,0x6b,4);
      Am_Style::operator=(&local_88,pAVar5);
      bVar2 = Am_Point_List::Valid(&local_78);
      uVar10 = (undefined7)(uVar9 >> 8);
      local_ac = (uint)CONCAT71((int7)((ulong)extraout_RDX_01 >> 8),1);
      if (pAVar4 != (Am_Drawonable *)0x0 && bVar2) goto LAB_001e7ed2;
      break;
    default:
      if (AVar3 == 0x7d2) goto switchD_001e7de9_caseD_4;
    }
    Am_Web_Events::Next(events);
  } while( true );
}

Assistant:

static void
polygon_web_validate(Am_Web_Events &events)
{
  events.End();
  Am_Slot slot = events.Get();
  Am_Object self = slot.Get_Owner();
  Am_Drawonable *draw = Get_a_drawonable(self);
  Am_Point_List pl = self.Get(Am_POINT_LIST);
  Am_Style ls = self.Get(Am_LINE_STYLE);
  int left = self.Get(Am_LEFT);
  int top = self.Get(Am_TOP);
  int width = self.Get(Am_WIDTH);
  int height = self.Get(Am_HEIGHT);

  bool rescaled = false;
  bool pl_changed = false;
  bool bbox_changed = false;

  // compute ORIGINAL values of left/top/width/height by working
  // backwards through the change events
  events.End();
  while (!events.First()) {
    slot = events.Get();

    Am_Slot_Key key = slot.Get_Key();
    if (key == Am_POINT_LIST) {
      // these changes supersedes all earlier changes, so find its
      // bounding box and stop looking backwards
      if (pl.Valid() && draw)
        draw->Get_Polygon_Bounding_Box(pl, ls, left, top, width, height);
      bbox_changed = true;
      break;
    } else
      switch (key) {
      case Am_WINDOW:
      case Am_DRAWONABLE:
        break;
      case Am_LINE_STYLE:
        ls = events.Get_Prev_Value();
        break;
      case Am_LEFT:
        left = events.Get_Prev_Value();
        break;
      case Am_TOP:
        top = events.Get_Prev_Value();
        break;
      case Am_WIDTH:
        width = events.Get_Prev_Value();
        break;
      case Am_HEIGHT:
        height = events.Get_Prev_Value();
        break;

      default:
        Am_ERROR("** Bug: unexpected slot in polygon_web_validate: "
                 << Am_Get_Slot_Name(key));
      }

    events.Prev();
  }

  // now go forwards, looking at the CHANGES made to each slot
  events.Next();
  while (!events.Last()) {
    slot = events.Get();
    switch (slot.Get_Key()) {
#if 0
    case Am_POINT_LIST:
      pl = self.Get (Am_POINT_LIST);
      if (pl.Valid() && draw)
	draw->Get_Polygon_Bounding_Box(pl, ls, left, top, width, height);
      bbox_changed = true;
      break;
#endif

    case Am_WINDOW:
    case Am_DRAWONABLE:
      if (pl.Valid() && draw)
        draw->Get_Polygon_Bounding_Box(pl, ls, left, top, width, height);
      bbox_changed = true;
      break;

    case Am_LINE_STYLE:
      // recompute bounding box with new line style
      ls = self.Get(Am_LINE_STYLE, Am_NO_DEPENDENCY);
      if (pl.Valid() && draw)
        draw->Get_Polygon_Bounding_Box(pl, ls, left, top, width, height);
      bbox_changed = true;
      break;

    case Am_LEFT: {
      int new_left = self.Get(Am_LEFT, Am_NO_DEPENDENCY);
      pl.Translate(new_left - left, 0);
      left = new_left;
      pl_changed = true;
      break;
    }

    case Am_TOP: {
      int new_top = self.Get(Am_TOP, Am_NO_DEPENDENCY);
      pl.Translate(0, new_top - top);
      top = new_top;
      pl_changed = true;
      break;
    }

    case Am_WIDTH: {
      int new_width = self.Get(Am_WIDTH, Am_NO_DEPENDENCY);
      pl.Scale(scale_factor(new_width, width), 1.0f, left, top);
      width = new_width;
      rescaled = true;
      pl_changed = true;
      break;
    }

    case Am_HEIGHT: {
      int new_height = self.Get(Am_HEIGHT, Am_NO_DEPENDENCY);
      pl.Scale(1.0f, scale_factor(new_height, height), left, top);
      height = new_height;
      rescaled = true;
      pl_changed = true;
      break;
    }
    }
    events.Next();
  }

  if (rescaled && pl.Valid() && draw)
    // check that scaling produced a polygon with the correct bounding box.
    // how could this fail?  several possibilities: line thickness
    // doesn't scale;  and mitered joins may grow or shrink
    // orthogonally to the scaling.

    general_polygon_validate(pl, left, top, width, height, ls, draw);

#ifdef TEST_POLYGON_CONSTRAINT
  // debugging check that bounding box is correct
  if (pl.Valid() && draw) {
    int curr_left, curr_top, curr_width, curr_height;
    draw->Get_Polygon_Bounding_Box(pl, ls, curr_left, curr_top, curr_width,
                                   curr_height);
    if (!(left == curr_left && top == curr_top && width == curr_width &&
          height == curr_height))
      std::cout << "** polygon_web_validate: bounding box (" << left << ","
                << top << "," << width << "," << height << ")"
                << " inconsistent with point list (" << curr_left << ","
                << curr_top << "," << curr_width << "," << curr_height << ")"
                << std::endl;
  }
#endif

  if (pl_changed)
    self.Set(Am_POINT_LIST, pl);

  if (bbox_changed) {
    self.Set(Am_LEFT, left);
    self.Set(Am_TOP, top);
    self.Set(Am_WIDTH, width);
    self.Set(Am_HEIGHT, height);
  }
}